

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-make.c
# Opt level: O2

object * make_gold(wchar_t lev,char *coin_type)

{
  uint32_t uVar1;
  object *obj;
  object_kind *k;
  wchar_t value;
  wchar_t wVar2;
  
  uVar1 = Rand_div(lev * 2 + 0x15);
  obj = (object *)mem_zalloc(0x138);
  for (value = ((lev << 4) / 10 - lev) + uVar1 + L'\x06';
      (uVar1 = Rand_div(100), uVar1 == 0 && (value < L'್')); value = value * 10) {
  }
  k = money_kind(coin_type,value);
  object_prep(obj,k,lev,RANDOMISE);
  wVar2 = value;
  if (((player->opts).opt[0x26] == true) && (wVar2 = value * 5, player->depth == 0)) {
    wVar2 = value;
  }
  if (L'翾' < wVar2) {
    uVar1 = Rand_div(200);
    wVar2 = L'翿' - uVar1;
  }
  obj->pval = (int16_t)wVar2;
  return obj;
}

Assistant:

struct object *make_gold(int lev, const char *coin_type)
{
	/* This average is 16 at dlev0, 80 at dlev40, 176 at dlev100. */
	int avg = (16 * lev)/10 + 16;
	int spread = lev + 10;
	int value = rand_spread(avg, spread);
	struct object *new_gold = mem_zalloc(sizeof(*new_gold)); 

	/* Increase the range to infinite, moving the average to 110% */
	while (one_in_(100) && value * 10 <= SHRT_MAX)
		value *= 10;

	/* Prepare a gold object */
	object_prep(new_gold, money_kind(coin_type, value), lev, RANDOMISE);

	/* If we're playing with no_selling, increase the value */
	if (OPT(player, birth_no_selling) && player->depth)	{
		value *= 5;
	}

	/* Cap gold at max short (or alternatively make pvals int32_t) */
	if (value >= SHRT_MAX) {
		value = SHRT_MAX - randint0(200);
	}

	new_gold->pval = value;

	return new_gold;
}